

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::ComputeConstraintImpulsesNullSpace
               (Model *model,VectorNd *Q,VectorNd *QDotMinus,ConstraintSet *CS,VectorNd *QDotPlus)

{
  long startCol;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  long in_RCX;
  VectorNd *in_stack_00000258;
  VectorNd *in_stack_00000260;
  VectorNd *in_stack_00000268;
  Model *in_stack_00000270;
  VectorNd *in_stack_000004c8;
  VectorNd *in_stack_000004d0;
  VectorNd *in_stack_000004d8;
  VectorNd *in_stack_000004e0;
  MatrixNd *in_stack_000004e8;
  MatrixNd *in_stack_000004f0;
  MatrixNd *in_stack_00000500;
  MatrixNd *in_stack_00000508;
  VectorNd *in_stack_00000510;
  VectorNd *in_stack_00000518;
  LinearSolver *in_stack_00000520;
  undefined1 in_stack_00000caf;
  MatrixNd *in_stack_00000cb0;
  VectorNd *in_stack_00000cb8;
  Model *in_stack_00000cc0;
  EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_fffffffffffffe48;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe50;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe58;
  ConstraintSet *in_stack_fffffffffffffe60;
  VectorNd *in_stack_fffffffffffffe68;
  Model *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 uVar1;
  undefined1 *startRow;
  undefined1 local_70 [40];
  non_const_type local_48;
  long local_38;
  
  uVar1 = 0;
  local_38 = in_RCX;
  UpdateKinematicsCustom(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
  CompositeRigidBodyAlgorithm
            (in_stack_00000cc0,in_stack_00000cb8,in_stack_00000cb0,(bool)in_stack_00000caf);
  CalcConstraintsJacobian
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             &in_stack_fffffffffffffe58->m_qr,SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
  startCol = local_38 + 0x380;
  local_48 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        in_stack_fffffffffffffe48);
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  compute<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (in_stack_fffffffffffffe50,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffffe48);
  startRow = local_70;
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQ
            (in_stack_fffffffffffffe58);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffffe50->m_qr,
             (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
              *)in_stack_fffffffffffffe48);
  this = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_38 + 0x458);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6e2913);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6e292c);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
            (this,(Index)startRow,startCol,CONCAT44(uVar1,in_stack_fffffffffffffe78),
             (long)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffffe50->m_qr,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             in_stack_fffffffffffffe48);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6e298e);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6e29a0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6e29b5);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6e29ce);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
            (this,(Index)startRow,startCol,CONCAT44(uVar1,in_stack_fffffffffffffe78),
             (long)in_stack_fffffffffffffe70);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffffe50->m_qr,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             in_stack_fffffffffffffe48);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffe50,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffe48);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48)
  ;
  SolveConstrainedSystemNullSpace
            (in_stack_000004f0,in_stack_000004e8,in_stack_000004e0,in_stack_000004d8,
             in_stack_000004d0,in_stack_000004c8,in_stack_00000500,in_stack_00000508,
             in_stack_00000510,in_stack_00000518,in_stack_00000520);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6e2b0e);
  return;
}

Assistant:

RBDL_DLLAPI
void ComputeConstraintImpulsesNullSpace (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDotMinus,
  ConstraintSet &CS,
  Math::VectorNd &QDotPlus
)
{

  // Compute H
  UpdateKinematicsCustom (model, &Q, NULL, NULL);
  CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

  // Compute G
  CalcConstraintsJacobian (model, Q, CS, CS.G, false);

  CS.GT_qr.compute(CS.G.transpose());
  CS.GT_qr_Q = CS.GT_qr.householderQ();

  CS.Y = CS.GT_qr_Q.block (0,0,QDotMinus.rows(), CS.G.rows());
  CS.Z = CS.GT_qr_Q.block (0,CS.G.rows(),QDotMinus.rows(), QDotMinus.rows()
                           - CS.G.rows());

  SolveConstrainedSystemNullSpace (CS.H, CS.G, CS.H * QDotMinus, CS.v_plus
                                   , QDotPlus, CS.impulse, CS.Y, CS.Z, CS.qddot_y, CS.qddot_z
                                   , CS.linear_solver);
}